

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::DynamicTypeHandler::InvalidateInlineCachesForAllProperties<false>
          (DynamicTypeHandler *this,ScriptContext *requestContext)

{
  int iVar1;
  int propertyId_00;
  uint local_28;
  PropertyId propertyId;
  int i;
  int count;
  ScriptContext *requestContext_local;
  DynamicTypeHandler *this_local;
  
  iVar1 = (*this->_vptr_DynamicTypeHandler[6])();
  if (iVar1 < 0x80) {
    for (local_28 = 0; (int)local_28 < iVar1; local_28 = local_28 + 1) {
      propertyId_00 =
           (*this->_vptr_DynamicTypeHandler[8])(this,requestContext,(ulong)(local_28 & 0xffff));
      if (propertyId_00 != -1) {
        ScriptContext::InvalidateProtoCaches(requestContext,propertyId_00);
      }
    }
    this_local._7_1_ = false;
  }
  else {
    ScriptContext::InvalidateAllProtoCaches(requestContext);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DynamicTypeHandler::InvalidateInlineCachesForAllProperties(ScriptContext* requestContext)
    {
        int count = GetPropertyCount();
        if (count < 128) // Invalidate a propertyId involves dictionary lookups. Only do this when the number is relatively small.
        {
            for (int i = 0; i < count; i++)
            {
                PropertyId propertyId = GetPropertyId(requestContext, static_cast<PropertyIndex>(i));
                if (propertyId != Constants::NoProperty)
                {
                    isStoreField ? requestContext->InvalidateStoreFieldCaches(propertyId) : requestContext->InvalidateProtoCaches(propertyId);
                }
            }
            return false;
        }
        else
        {
            isStoreField ? requestContext->InvalidateAllStoreFieldCaches() : requestContext->InvalidateAllProtoCaches();
            return true;
        }
    }